

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  *(undefined ***)&this->field_0xc0 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0xc8 = 0;
  *(char **)&this->field_0xd0 = "IfcCShapeProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__007c4ed8);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7c4e48;
  *(undefined8 *)&this->field_0xc0 = 0x7c4ec0;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x7c4e70
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x7c4e98;
  (this->InternalFilletRadius).have = false;
  (this->CentreOfGravityInX).have = false;
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}